

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  float fVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  size_t sVar26;
  long lVar27;
  unsigned_long uVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  ulong uVar32;
  long lVar33;
  vuint<4> vprimID;
  vuint<4> vgeomID;
  MutexSys *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  MutexSys *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ThreadLocal2 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ThreadLocal2 *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *local_60;
  float local_58 [10];
  
  uVar28 = set->_begin;
  uVar22 = (set->_end - uVar28) + 3;
  uVar23 = uVar22 >> 2;
  local_f8 = (MutexSys *)(uVar23 * 0xe0);
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_c0 = CONCAT71(uStack_c0._1_7_,1);
    local_c8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_120 = CONCAT71(uStack_120._1_7_,1);
    local_98 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_98);
    }
    else {
      *__position._M_current = local_98;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)uStack_120 == '\x01') {
      MutexSys::unlock(local_128);
    }
    if ((char)uStack_c0 == '\x01') {
      MutexSys::unlock(&local_c8->mutex);
    }
  }
  pTVar5->bytesUsed = (long)&local_f8->mutex + pTVar5->bytesUsed;
  sVar26 = pTVar5->cur;
  uVar29 = (ulong)(-(int)sVar26 & 0xf);
  uVar32 = (long)&local_f8->mutex + uVar29 + sVar26;
  pTVar5->cur = uVar32;
  if (pTVar5->end < uVar32) {
    pTVar5->cur = sVar26;
    if ((MutexSys *)pTVar5->allocBlockSize < (MutexSys *)((long)local_f8 << 2)) {
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_f8);
    }
    else {
      local_128 = (MutexSys *)pTVar5->allocBlockSize;
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar5->ptr = pcVar24;
      sVar26 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar26;
      pTVar5->cur = 0;
      pTVar5->end = (size_t)local_128;
      pTVar5->cur = (size_t)local_f8;
      if (local_128 < local_f8) {
        pTVar5->cur = 0;
        local_128 = (MutexSys *)pTVar5->allocBlockSize;
        pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar5->ptr = pcVar24;
        sVar26 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar26;
        pTVar5->cur = 0;
        pTVar5->end = (size_t)local_128;
        pTVar5->cur = (size_t)local_f8;
        if (local_128 < local_f8) {
          pTVar5->cur = 0;
          pcVar24 = (char *)0x0;
        }
        else {
          pTVar5->bytesWasted = sVar26;
        }
      }
      else {
        pTVar5->bytesWasted = sVar26;
      }
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar29;
    pcVar24 = pTVar5->ptr + (uVar32 - (long)local_f8);
  }
  if (3 < uVar22) {
    lVar30 = uVar23 + (uVar23 == 0);
    lVar27 = 0;
    local_68 = lVar30;
    local_60 = this;
    do {
      uVar22 = set->_end;
      local_58[4] = -NAN;
      local_58[5] = -NAN;
      local_58[6] = -NAN;
      local_58[7] = -NAN;
      local_58[0] = -NAN;
      local_58[1] = -NAN;
      local_58[2] = -NAN;
      local_58[3] = -NAN;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = (MutexSys *)0x0;
      uStack_120 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = (ThreadLocal2 *)0x0;
      uStack_c0 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = (ThreadLocal2 *)0x0;
      uStack_90 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = (MutexSys *)0x0;
      uStack_f0 = 0;
      if (uVar28 < uVar22) {
        pRVar6 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        pfVar31 = prims[uVar28].upper.field_0.m128 + 3;
        uVar32 = 0;
        do {
          fVar4 = *pfVar31;
          pGVar7 = pRVar6[(uint)pfVar31[-4]].ptr;
          lVar33 = (ulong)(uint)fVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar30 = *(long *)&pGVar7->field_0x58;
          lVar8 = *(long *)&pGVar7[1].time_range.upper;
          p_Var9 = pGVar7[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + lVar33) * (long)p_Var9);
          uVar10 = *puVar2;
          uVar11 = puVar2[1];
          uVar12 = puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 4 + lVar33) * (long)p_Var9);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          uVar15 = puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 8 + lVar33) * (long)p_Var9);
          uVar16 = *puVar2;
          uVar17 = puVar2[1];
          uVar18 = puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 0xc + lVar33) * (long)p_Var9);
          uVar19 = *puVar2;
          uVar20 = puVar2[1];
          uVar21 = puVar2[2];
          local_58[uVar32 + 4] = pfVar31[-4];
          local_58[uVar32] = fVar4;
          *(undefined4 *)((long)&local_128 + uVar32 * 4) = uVar10;
          *(undefined4 *)((long)&local_118 + uVar32 * 4) = uVar11;
          *(undefined4 *)((long)&local_108 + uVar32 * 4) = uVar12;
          *(undefined4 *)((long)&local_c8 + uVar32 * 4) = uVar13;
          *(undefined4 *)((long)&local_b8 + uVar32 * 4) = uVar14;
          *(undefined4 *)((long)&local_a8 + uVar32 * 4) = uVar15;
          *(undefined4 *)((long)&local_98 + uVar32 * 4) = uVar16;
          *(undefined4 *)((long)&local_88 + uVar32 * 4) = uVar17;
          *(undefined4 *)((long)&local_78 + uVar32 * 4) = uVar18;
          *(undefined4 *)((long)&local_f8 + uVar32 * 4) = uVar19;
          *(undefined4 *)((long)&local_e8 + uVar32 * 4) = uVar20;
          *(undefined4 *)((long)&local_d8 + uVar32 * 4) = uVar21;
          uVar29 = uVar32 + 1;
          if (2 < uVar32) break;
          lVar30 = uVar32 + uVar28;
          pfVar31 = pfVar31 + 8;
          uVar32 = uVar29;
        } while (lVar30 + 1U < uVar22);
        uVar28 = uVar28 + uVar29;
        lVar30 = local_68;
        this = local_60;
      }
      pcVar25 = pcVar24 + lVar27 * 0xe0;
      *(MutexSys **)pcVar25 = local_128;
      *(undefined8 *)(pcVar25 + 8) = uStack_120;
      *(undefined8 *)(pcVar25 + 0x10) = local_118;
      *(undefined8 *)(pcVar25 + 0x18) = uStack_110;
      *(undefined8 *)(pcVar25 + 0x20) = local_108;
      *(undefined8 *)(pcVar25 + 0x28) = uStack_100;
      *(ThreadLocal2 **)(pcVar25 + 0x30) = local_c8;
      *(undefined8 *)(pcVar25 + 0x38) = uStack_c0;
      *(undefined8 *)(pcVar25 + 0x40) = local_b8;
      *(undefined8 *)(pcVar25 + 0x48) = uStack_b0;
      *(undefined8 *)(pcVar25 + 0x50) = local_a8;
      *(undefined8 *)(pcVar25 + 0x58) = uStack_a0;
      *(ThreadLocal2 **)(pcVar25 + 0x60) = local_98;
      *(undefined8 *)(pcVar25 + 0x68) = uStack_90;
      *(undefined8 *)(pcVar25 + 0x70) = local_88;
      *(undefined8 *)(pcVar25 + 0x78) = uStack_80;
      *(undefined8 *)(pcVar25 + 0x80) = local_78;
      *(undefined8 *)(pcVar25 + 0x88) = uStack_70;
      *(MutexSys **)(pcVar25 + 0x90) = local_f8;
      *(undefined8 *)(pcVar25 + 0x98) = uStack_f0;
      *(undefined8 *)(pcVar25 + 0xa0) = local_e8;
      *(undefined8 *)(pcVar25 + 0xa8) = uStack_e0;
      *(undefined8 *)(pcVar25 + 0xb0) = local_d8;
      *(undefined8 *)(pcVar25 + 0xb8) = uStack_d0;
      *(ulong *)(pcVar25 + 0xc0) = CONCAT44(local_58[5],local_58[4]);
      *(ulong *)(pcVar25 + 200) = CONCAT44(local_58[7],local_58[6]);
      *(ulong *)(pcVar25 + 0xd0) = CONCAT44(local_58[1],local_58[0]);
      *(ulong *)(pcVar25 + 0xd8) = CONCAT44(local_58[3],local_58[2]);
      lVar27 = lVar27 + 1;
    } while (lVar27 != lVar30);
  }
  uVar22 = 7;
  if (uVar23 < 7) {
    uVar22 = uVar23;
  }
  return (NodeRef)(uVar22 | (ulong)pcVar24 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }